

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

kTRContinueMode int_trp_assert_error_v2(int line,char *file,char *exp)

{
  kTRContinueMode kVar1;
  long local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  trun::TestRunner::GetCurrentTestModule();
  kVar1 = trun::TestResponseProxy::AssertError((TestResponseProxy *)(local_30 + 0xa0),exp,file,line)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return kVar1;
}

Assistant:

static kTRContinueMode int_trp_assert_error_v2(int line, const char *file, const char *exp) {
    // Just swizzle the arguments back to the old interface..
    return TestRunner::GetCurrentTestModule()->GetTestResponseProxy().AssertError(exp, file, line);
}